

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O2

size_t __thiscall helics::apps::Connector::addTag(Connector *this,string_view tagName)

{
  size_t hash;
  size_t local_30;
  string_view local_28;
  
  local_28._M_str = tagName._M_str;
  local_28._M_len = tagName._M_len;
  local_30 = CLI::std::hash<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                       ((hash<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_30,
                        &local_28);
  std::
  _Hashtable<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<unsigned_long_const&,std::basic_string_view<char,std::char_traits<char>>&>
            ((_Hashtable<unsigned_long,std::pair<unsigned_long_const,std::__cxx11::string>,std::allocator<std::pair<unsigned_long_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<unsigned_long>,std::hash<unsigned_long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->tags,&local_30,&local_28);
  return local_30;
}

Assistant:

std::size_t Connector::addTag(std::string_view tagName)
{
    const std::size_t hash = std::hash<std::string_view>()(tagName);
    tags.emplace(hash, tagName);
    return hash;
}